

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  seqDef *psVar2;
  bool bVar3;
  undefined8 uVar4;
  U32 lowestValid;
  uint uVar5;
  BYTE *pBVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *puVar10;
  long lVar11;
  ulong *puVar12;
  int iVar13;
  ulong *puVar14;
  BYTE *pBVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  BYTE *litEnd;
  uint uVar23;
  ulong *ip;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  uint local_a8;
  uint local_a4;
  size_t local_a0;
  BYTE *local_98;
  ulong *local_90;
  ZSTD_matchState_t *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  long local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong *local_48;
  uint *local_40;
  BYTE *local_38;
  
  puVar14 = (ulong *)((long)src + srcSize);
  pBVar15 = (ms->window).base;
  uVar5 = (ms->window).dictLimit;
  local_38 = pBVar15 + uVar5;
  uVar20 = (ms->cParams).minMatch;
  uVar21 = 6;
  if (uVar20 < 6) {
    uVar21 = uVar20;
  }
  uVar20 = 4;
  if (4 < uVar21) {
    uVar20 = uVar21;
  }
  local_4c = *rep;
  ip = (ulong *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar13 = (int)ip - (int)pBVar15;
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_50 = iVar13 - uVar21;
  if (iVar13 - uVar5 <= uVar21) {
    local_50 = uVar5;
  }
  if (ms->loadedDictEnd != 0) {
    local_50 = uVar5;
  }
  local_54 = rep[1];
  local_50 = iVar13 - local_50;
  local_a4 = local_54;
  if (local_50 < local_54) {
    local_a4 = 0;
  }
  local_a8 = local_4c;
  if (local_50 < local_4c) {
    local_a8 = 0;
  }
  local_78 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_40 = rep;
  if (ip < local_78) {
    puVar8 = (ulong *)((long)puVar14 + -7);
    local_68 = (ulong *)((long)puVar14 + -3);
    local_70 = (ulong *)((long)puVar14 + -1);
    local_48 = puVar14 + -4;
    local_90 = puVar14;
    local_88 = ms;
    local_80 = puVar8;
    do {
      local_60 = -(ulong)local_a8;
      if (local_a8 == 0) {
        pBVar15 = (BYTE *)0x0;
      }
      else {
        pBVar15 = (BYTE *)0x0;
        if (*(int *)(((long)ip + 1) - (ulong)local_a8) == *(int *)((long)ip + 1)) {
          puVar16 = (ulong *)((long)ip + 5);
          puVar9 = (ulong *)((long)ip + local_60 + 5);
          puVar12 = puVar16;
          if (puVar16 < puVar8) {
            uVar18 = *puVar16 ^ *puVar9;
            uVar7 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            pBVar15 = (BYTE *)(uVar7 >> 3 & 0x1fffffff);
            if (*puVar9 == *puVar16) {
              puVar12 = (ulong *)((long)ip + 0xd);
              puVar9 = (ulong *)((long)ip + local_60 + 0xd);
              do {
                if (puVar8 <= puVar12) goto LAB_0016b095;
                uVar7 = *puVar9;
                uVar18 = *puVar12;
                uVar19 = uVar18 ^ uVar7;
                uVar17 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                pBVar15 = (BYTE *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar16));
                puVar12 = puVar12 + 1;
                puVar9 = puVar9 + 1;
              } while (uVar7 == uVar18);
            }
          }
          else {
LAB_0016b095:
            if ((puVar12 < local_68) && ((int)*puVar9 == (int)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar12 < local_70) && ((short)*puVar9 == (short)*puVar12)) {
              puVar12 = (ulong *)((long)puVar12 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar12 < puVar14) {
              puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar12));
            }
            pBVar15 = (BYTE *)((long)puVar12 - (long)puVar16);
          }
          pBVar15 = pBVar15 + 4;
        }
      }
      local_a0 = 999999999;
      if (uVar20 == 6) {
        pBVar6 = (BYTE *)ZSTD_BtFindBestMatch_noDict_6
                                   (local_88,(BYTE *)ip,(BYTE *)puVar14,&local_a0);
      }
      else if (uVar20 == 5) {
        pBVar6 = (BYTE *)ZSTD_BtFindBestMatch_noDict_5
                                   (local_88,(BYTE *)ip,(BYTE *)puVar14,&local_a0);
      }
      else {
        pBVar6 = (BYTE *)ZSTD_BtFindBestMatch_noDict_4
                                   (local_88,(BYTE *)ip,(BYTE *)puVar14,&local_a0);
      }
      local_98 = pBVar15;
      if (pBVar15 < pBVar6) {
        local_98 = pBVar6;
      }
      if (local_98 < (BYTE *)0x4) {
        uVar7 = (long)ip - (long)src;
        ip = (ulong *)((long)ip + (uVar7 >> 8) + 1);
        local_88->lazySkipping = (uint)(0x7ff < uVar7);
        puVar8 = local_80;
      }
      else {
        puVar8 = ip;
        uVar7 = local_a0;
        if (pBVar6 <= pBVar15) {
          puVar8 = (ulong *)((long)ip + 1);
          uVar7 = 1;
        }
        if (ip < local_78) {
          do {
            puVar16 = (ulong *)((long)ip + 1);
            if (((uVar7 != 0) && (local_a8 != 0)) &&
               (*(int *)puVar16 == *(int *)((long)puVar16 + local_60))) {
              puVar14 = (ulong *)((long)ip + 5);
              puVar9 = (ulong *)((long)ip + local_60 + 5);
              puVar12 = puVar14;
              if (puVar14 < local_80) {
                uVar17 = *puVar14 ^ *puVar9;
                uVar18 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                pBVar15 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                if (*puVar9 == *puVar14) {
                  puVar12 = (ulong *)((long)ip + 0xd);
                  puVar9 = (ulong *)((long)ip + local_60 + 0xd);
                  do {
                    if (local_80 <= puVar12) goto LAB_0016b260;
                    uVar18 = *puVar9;
                    uVar17 = *puVar12;
                    uVar22 = uVar17 ^ uVar18;
                    uVar19 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pBVar15 = (BYTE *)((long)puVar12 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar14))
                    ;
                    puVar12 = puVar12 + 1;
                    puVar9 = puVar9 + 1;
                  } while (uVar18 == uVar17);
                }
              }
              else {
LAB_0016b260:
                if ((puVar12 < local_68) && ((int)*puVar9 == (int)*puVar12)) {
                  puVar12 = (ulong *)((long)puVar12 + 4);
                  puVar9 = (ulong *)((long)puVar9 + 4);
                }
                if ((puVar12 < local_70) && ((short)*puVar9 == (short)*puVar12)) {
                  puVar12 = (ulong *)((long)puVar12 + 2);
                  puVar9 = (ulong *)((long)puVar9 + 2);
                }
                if (puVar12 < local_90) {
                  puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar12));
                }
                pBVar15 = (BYTE *)((long)puVar12 - (long)puVar14);
              }
              puVar14 = local_90;
              if (pBVar15 < (BYTE *)0xfffffffffffffffc) {
                uVar5 = 0x1f;
                if ((uint)uVar7 != 0) {
                  for (; (uint)uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)local_98 * 3 + -0x1e) < (int)(pBVar15 + 4) * 3) {
                  uVar7 = 1;
                  puVar8 = puVar16;
                  local_98 = pBVar15 + 4;
                }
              }
            }
            local_a0 = 999999999;
            if (uVar20 == 6) {
              pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_6
                                          (local_88,(BYTE *)puVar16,(BYTE *)puVar14,&local_a0);
            }
            else if (uVar20 == 5) {
              pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_5
                                          (local_88,(BYTE *)puVar16,(BYTE *)local_90,&local_a0);
            }
            else {
              pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_4
                                          (local_88,(BYTE *)puVar16,(BYTE *)local_90,&local_a0);
            }
            puVar14 = local_90;
            bVar3 = true;
            if ((BYTE *)0x3 < pBVar15) {
              uVar5 = 0x1f;
              if ((uint)uVar7 != 0) {
                for (; (uint)uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar13 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                }
              }
              if ((int)((uVar5 ^ 0x1f) + (int)local_98 * 4 + -0x1b) < (int)pBVar15 * 4 - iVar13) {
                bVar3 = false;
                puVar8 = puVar16;
                uVar7 = local_a0;
                local_98 = pBVar15;
              }
            }
            if (bVar3) {
              if (local_78 <= puVar16) break;
              puVar16 = (ulong *)((long)ip + 2);
              if (((uVar7 != 0) && (local_a8 != 0)) &&
                 (*(int *)puVar16 == *(int *)((long)puVar16 + local_60))) {
                puVar12 = (ulong *)((long)ip + 6);
                puVar10 = (ulong *)((long)ip + local_60 + 6);
                puVar9 = puVar12;
                if (puVar12 < local_80) {
                  uVar17 = *puVar12 ^ *puVar10;
                  uVar18 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  pBVar15 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                  if (*puVar10 == *puVar12) {
                    puVar9 = (ulong *)((long)ip + 0xe);
                    puVar10 = (ulong *)((long)ip + local_60 + 0xe);
                    do {
                      if (local_80 <= puVar9) goto LAB_0016b46e;
                      uVar18 = *puVar10;
                      uVar17 = *puVar9;
                      uVar22 = uVar17 ^ uVar18;
                      uVar19 = 0;
                      if (uVar22 != 0) {
                        for (; (uVar22 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                        }
                      }
                      pBVar15 = (BYTE *)((long)puVar9 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar12)
                                        );
                      puVar9 = puVar9 + 1;
                      puVar10 = puVar10 + 1;
                    } while (uVar18 == uVar17);
                  }
                }
                else {
LAB_0016b46e:
                  if ((puVar9 < local_68) && ((int)*puVar10 == (int)*puVar9)) {
                    puVar9 = (ulong *)((long)puVar9 + 4);
                    puVar10 = (ulong *)((long)puVar10 + 4);
                  }
                  if ((puVar9 < local_70) && ((short)*puVar10 == (short)*puVar9)) {
                    puVar9 = (ulong *)((long)puVar9 + 2);
                    puVar10 = (ulong *)((long)puVar10 + 2);
                  }
                  if (puVar9 < local_90) {
                    puVar9 = (ulong *)((long)puVar9 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar9));
                  }
                  pBVar15 = (BYTE *)((long)puVar9 - (long)puVar12);
                }
                if (pBVar15 < (BYTE *)0xfffffffffffffffc) {
                  uVar5 = 0x1f;
                  if ((uint)uVar7 != 0) {
                    for (; (uint)uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                    }
                  }
                  if ((int)((uVar5 ^ 0x1f) + (int)local_98 * 4 + -0x1e) < (int)(pBVar15 + 4) * 4) {
                    uVar7 = 1;
                    puVar8 = puVar16;
                    local_98 = pBVar15 + 4;
                  }
                }
              }
              local_a0 = 999999999;
              if (uVar20 == 6) {
                pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_6
                                            (local_88,(BYTE *)puVar16,(BYTE *)local_90,&local_a0);
              }
              else if (uVar20 == 5) {
                pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_5
                                            (local_88,(BYTE *)puVar16,(BYTE *)local_90,&local_a0);
              }
              else {
                pBVar15 = (BYTE *)ZSTD_BtFindBestMatch_noDict_4
                                            (local_88,(BYTE *)puVar16,(BYTE *)local_90,&local_a0);
              }
              bVar3 = true;
              if ((BYTE *)0x3 < pBVar15) {
                uVar5 = 0x1f;
                if ((uint)uVar7 != 0) {
                  for (; (uint)uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                iVar13 = 0x1f;
                if ((uint)local_a0 != 0) {
                  for (; (uint)local_a0 >> iVar13 == 0; iVar13 = iVar13 + -1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)local_98 * 4 + -0x18) < (int)pBVar15 * 4 - iVar13) {
                  bVar3 = false;
                  puVar8 = puVar16;
                  uVar7 = local_a0;
                  local_98 = pBVar15;
                }
              }
              if (bVar3) break;
            }
            ip = puVar16;
          } while (puVar16 < local_78);
        }
        uVar21 = local_a8;
        uVar5 = local_a4;
        if (3 < uVar7) {
          if ((src < puVar8) && (local_38 < (BYTE *)((long)puVar8 + (3 - uVar7)))) {
            puVar14 = puVar8;
            while (puVar8 = puVar14,
                  *(BYTE *)((long)puVar14 + -1) == *(BYTE *)((long)puVar14 + (2 - uVar7))) {
              puVar8 = (ulong *)((long)puVar14 + -1);
              local_98 = local_98 + 1;
              if ((puVar8 <= src) ||
                 (pBVar15 = (BYTE *)((long)puVar14 + (2 - uVar7)), puVar14 = puVar8,
                 pBVar15 <= local_38)) break;
            }
          }
          uVar21 = (U32)uVar7 - 3;
          uVar5 = local_a8;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0016ba4c:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0016ba6b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar18 = (long)puVar8 - (long)src;
        puVar14 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar14 + uVar18)) {
LAB_0016ba0e:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_90 < puVar8) {
LAB_0016ba2d:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < puVar8) {
          ZSTD_safecopyLiterals((BYTE *)puVar14,(BYTE *)src,(BYTE *)puVar8,(BYTE *)local_48);
        }
        else {
          uVar17 = *(ulong *)((long)src + 8);
          *puVar14 = *src;
          puVar14[1] = uVar17;
          if (0x10 < uVar18) {
            pBVar15 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar15 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar17 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar15 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar15 + 0x18) = uVar17;
            if (0x20 < (long)uVar18) {
              lVar11 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar1[1];
                pBVar6 = pBVar15 + lVar11 + 0x20;
                *(undefined8 *)pBVar6 = *puVar1;
                *(undefined8 *)(pBVar6 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar6 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar6 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar6 + 0x20 < pBVar15 + uVar18);
            }
          }
        }
        puVar14 = local_90;
        seqStore->lit = seqStore->lit + uVar18;
        if (0xffff < uVar18) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar2 = seqStore->sequences;
        psVar2->litLength = (U16)uVar18;
        psVar2->offBase = (U32)uVar7;
        if (local_98 < (BYTE *)0x3) {
LAB_0016ba8a:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if ((BYTE *)0xffff < local_98 + -3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0016baa9:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar2 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar2->mlBase = (U16)(local_98 + -3);
        seqStore->sequences = psVar2 + 1;
        if (local_88->lazySkipping != 0) {
          local_88->lazySkipping = 0;
        }
        ip = (ulong *)((long)puVar8 + (long)local_98);
        puVar8 = local_80;
        src = ip;
        local_a8 = uVar21;
        local_a4 = uVar5;
        if ((uVar5 != 0) && (ip <= local_78)) {
          while (uVar23 = uVar21, uVar7 = (ulong)uVar5, src = ip, local_a8 = uVar23,
                local_a4 = uVar5, (int)*ip == *(int *)((long)ip - uVar7)) {
            puVar16 = (ulong *)((long)ip + 4);
            puVar9 = (ulong *)((long)ip + (4 - uVar7));
            puVar12 = puVar16;
            if (puVar16 < puVar8) {
              uVar17 = *puVar16 ^ *puVar9;
              uVar18 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              pBVar15 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
              if (*puVar9 == *puVar16) {
                puVar12 = (ulong *)((long)ip + 0xc);
                puVar9 = (ulong *)((long)ip + (0xc - uVar7));
                do {
                  if (puVar8 <= puVar12) goto LAB_0016b860;
                  uVar7 = *puVar9;
                  uVar18 = *puVar12;
                  uVar19 = uVar18 ^ uVar7;
                  uVar17 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  pBVar15 = (BYTE *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar16));
                  puVar12 = puVar12 + 1;
                  puVar9 = puVar9 + 1;
                } while (uVar7 == uVar18);
              }
            }
            else {
LAB_0016b860:
              if ((puVar12 < local_68) && ((int)*puVar9 == (int)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 4);
                puVar9 = (ulong *)((long)puVar9 + 4);
              }
              if ((puVar12 < local_70) && ((short)*puVar9 == (short)*puVar12)) {
                puVar12 = (ulong *)((long)puVar12 + 2);
                puVar9 = (ulong *)((long)puVar9 + 2);
              }
              if (puVar12 < puVar14) {
                puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar12));
              }
              pBVar15 = (BYTE *)((long)puVar12 - (long)puVar16);
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_0016ba4c;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0016ba6b;
            puVar16 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar16) goto LAB_0016ba0e;
            if (puVar14 < ip) goto LAB_0016ba2d;
            if (local_48 < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar16,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_48);
              puVar8 = local_80;
            }
            else {
              uVar7 = ip[1];
              *puVar16 = *ip;
              puVar16[1] = uVar7;
            }
            psVar2 = seqStore->sequences;
            psVar2->litLength = 0;
            psVar2->offBase = 1;
            if (pBVar15 + 4 < (BYTE *)0x3) goto LAB_0016ba8a;
            if ((BYTE *)0xffff < pBVar15 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016baa9;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar2 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar2->mlBase = (U16)(pBVar15 + 1);
            seqStore->sequences = psVar2 + 1;
            ip = (ulong *)((long)ip + (long)(pBVar15 + 4));
            src = ip;
            local_a8 = uVar5;
            local_a4 = uVar23;
            if ((uVar23 == 0) || (uVar21 = uVar5, uVar5 = uVar23, local_78 < ip)) break;
          }
        }
      }
    } while (ip < local_78);
  }
  if (local_54 <= local_50) {
    local_54 = 0;
  }
  uVar5 = local_54;
  if (local_a8 != 0) {
    uVar5 = local_4c;
  }
  if (local_4c <= local_50) {
    uVar5 = local_54;
    local_4c = 0;
  }
  if (local_a8 != 0) {
    local_4c = local_a8;
  }
  if (local_a4 != 0) {
    uVar5 = local_a4;
  }
  *local_40 = local_4c;
  local_40[1] = uVar5;
  return (long)puVar14 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}